

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlwrap.c
# Opt level: O2

void * dlwrap_real_dlopen(char *filename,int flag)

{
  void *pvVar1;
  
  if (dlwrap_real_dlopen::real_dlopen == (fips_dlopen_t)0x0) {
    dlwrap_real_dlopen::real_dlopen =
         (fips_dlopen_t)dlwrap_real_dlsym((void *)0xffffffffffffffff,"dlopen");
    if (dlwrap_real_dlopen::real_dlopen == (fips_dlopen_t)0x0) {
      fwrite("Error: Failed to find symbol for dlopen.\n",0x29,1,_stderr);
      exit(1);
    }
  }
  pvVar1 = (*dlwrap_real_dlopen::real_dlopen)(filename,flag);
  return pvVar1;
}

Assistant:

void *
dlwrap_real_dlopen(const char *filename, int flag)
{
    static fips_dlopen_t real_dlopen = NULL;

    if (!real_dlopen) {
        real_dlopen = (fips_dlopen_t) dlwrap_real_dlsym(RTLD_NEXT, "dlopen");
        if (!real_dlopen) {
            fprintf(stderr, "Error: Failed to find symbol for dlopen.\n");
            exit(1);
        }
    }

    return real_dlopen(filename, flag);
}